

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int CreateMux(char *filename,WebPMux **mux)

{
  int iVar1;
  WebPMux *pWVar2;
  long *in_RSI;
  undefined8 in_RDI;
  WebPData bitstream;
  int in_stack_ffffffffffffffdc;
  WebPData *in_stack_ffffffffffffffe0;
  int local_4;
  
  iVar1 = ExUtilReadFileToWebPData((char *)in_RSI,in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pWVar2 = WebPMuxCreate(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    *in_RSI = (long)pWVar2;
    WebPDataClear((WebPData *)0x104d1a);
    if (*in_RSI == 0) {
      fprintf(_stderr,"Failed to create mux object from file %s.\n",in_RDI);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int CreateMux(const char* const filename, WebPMux** mux) {
  WebPData bitstream;
  assert(mux != NULL);
  if (!ExUtilReadFileToWebPData(filename, &bitstream)) return 0;
  *mux = WebPMuxCreate(&bitstream, 1);
  WebPDataClear(&bitstream);
  if (*mux != NULL) return 1;
  WFPRINTF(stderr, "Failed to create mux object from file %s.\n",
           (const W_CHAR*)filename);
  return 0;
}